

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_load_lattice(s3lattice_t **out_lattice,char *lat_dir,char *lat_ext)

{
  int iVar1;
  char local_438 [8];
  char fn [1024];
  char *local_30;
  char *rel_path;
  char *lat_ext_local;
  char *lat_dir_local;
  s3lattice_t **out_lattice_local;
  
  if (cur_ctl_utt_id == (char *)0x0) {
    local_30 = cur_ctl_path;
  }
  else {
    local_30 = cur_ctl_utt_id;
  }
  sprintf(local_438,"%s/%s.%s",lat_dir,local_30,lat_ext);
  iVar1 = s3lattice_read(local_438,out_lattice);
  if (iVar1 < 0) {
    out_lattice_local._4_4_ = -1;
  }
  else {
    out_lattice_local._4_4_ = 0;
  }
  return out_lattice_local._4_4_;
}

Assistant:

int
corpus_load_lattice(s3lattice_t **out_lattice, const char *lat_dir, const char *lat_ext)
{
    char *rel_path;
    char fn[1024];

    /* If control file specifies an utt ID, use it.  O/W use the path */
    if (cur_ctl_utt_id != NULL)
	rel_path = cur_ctl_utt_id;
    else {
	rel_path = cur_ctl_path;
    }

    sprintf(fn, "%s/%s.%s",  lat_dir, rel_path, lat_ext);
    if (s3lattice_read(fn, out_lattice) < 0)
	return S3_ERROR;
    
    return S3_SUCCESS;
}